

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O2

int __thiscall
TPZSkylNSymMatrix<float>::Subst_LForward(TPZSkylNSymMatrix<float> *this,TPZFMatrix<float> *B)

{
  char cVar1;
  float **ppfVar2;
  float *pfVar3;
  int iVar4;
  undefined4 extraout_var;
  int extraout_var_00;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  int iVar8;
  long row;
  int64_t j;
  long col;
  float fVar9;
  
  lVar5 = (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0xc])();
  iVar8 = 0;
  if ((lVar5 == CONCAT44(extraout_var,iVar4)) &&
     ((cVar1 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed, cVar1 == '\x04' ||
      (cVar1 == '\x01')))) {
    iVar4 = (*(this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0xc])(this);
    row = 0;
    lVar5 = CONCAT44(extraout_var_00,iVar4);
    if (CONCAT44(extraout_var_00,iVar4) == 0 || extraout_var_00 < 0) {
      lVar5 = row;
    }
    for (; row != lVar5; row = row + 1) {
      for (col = 0; col < (B->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol; col = col + 1) {
        ppfVar2 = (this->fElemb).fStore;
        pfVar7 = ppfVar2[row];
        pfVar3 = ppfVar2[row + 1];
        pfVar6 = TPZFMatrix<float>::operator()(B,row,col);
        fVar9 = 0.0;
        while( true ) {
          pfVar7 = pfVar7 + 1;
          pfVar6 = pfVar6 + -1;
          if (pfVar3 <= pfVar7) break;
          fVar9 = fVar9 + *pfVar7 * *pfVar6;
        }
        pfVar7 = TPZFMatrix<float>::operator()(B,row,col);
        *pfVar7 = *pfVar7 - fVar9;
      }
    }
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int TPZSkylNSymMatrix<TVar>::Subst_LForward(TPZFMatrix<TVar> *B)const
{
  if ((B->Rows() != this->Dim()) || (this->fDecomposed != ELDLt && this->fDecomposed != ELU))
    return(0);

  int64_t dimension = this->Dim();
  for (int64_t k = 0; k < dimension; k++)
  {
    for (int64_t j = 0; j < B->Cols(); j++)
    {
      // Faz sum = SOMA( A[k,i] * B[i,j] ), para i = 1, ..., k-1.
      //
      TVar sum = 0.0;
      TVar *elem_ki = fElemb[k] + 1;
      TVar *end_ki = fElemb[k + 1];
      TVar *BPtr = &(*B)(k, j);
      while (elem_ki < end_ki)
        sum += (*elem_ki++) * (*--BPtr);

      // Faz B[k,j] = (B[k,j] - sum) / A[k,k].
      //
      // B->PutVal( k, j, (B->GetVal(k, j) - sum) / row_k->pElem[0] );
      BPtr = &(*B)(k, j);
      *BPtr -= sum;
    }
  }
  return(1);
}